

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Scene::update(Scene *this,ResourcePack *resource_pack)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  pointer pfVar4;
  pointer puVar5;
  bool bVar6;
  uint uVar7;
  GLenum GVar8;
  Mesh *pMVar9;
  ostream *poVar10;
  int iVar11;
  vector<float,_std::allocator<float>_> *this_01;
  int iVar12;
  int iVar13;
  float fVar14;
  string box_mesh;
  
  this_01 = &this->grid_vertices;
  std::vector<float,_std::allocator<float>_>::reserve
            (this_01,((long)this->grid_width + 1) * ((long)this->grid_height + 1));
  if (-1 < this->grid_height) {
    this_00 = &this->grid_indices;
    iVar11 = 1;
    iVar12 = 0;
    do {
      if (-1 < this->grid_width) {
        iVar13 = 0;
        do {
          fVar14 = (float)(this->grid_cell_size * iVar13 + this->grid_start_x);
          box_mesh._M_dataplus._M_p._0_4_ = fVar14;
          iVar2._M_current =
               (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar2,(float *)&box_mesh);
          }
          else {
            *iVar2._M_current = fVar14;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          box_mesh._M_dataplus._M_p._0_4_ = -1.0;
          iVar2._M_current =
               (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar2,(float *)&box_mesh);
          }
          else {
            *iVar2._M_current = -1.0;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          fVar14 = (float)(this->grid_cell_size * iVar12 + this->grid_start_y);
          box_mesh._M_dataplus._M_p._0_4_ = fVar14;
          iVar2._M_current =
               (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar2,(float *)&box_mesh);
          }
          else {
            *iVar2._M_current = fVar14;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          iVar1 = this->grid_height;
          if (iVar13 < iVar1 && iVar12 < iVar1) {
            uVar7 = (iVar1 + 1) * iVar12 + iVar13;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            uVar7 = (this->grid_height + 1) * iVar12 + iVar13 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            uVar7 = (this->grid_height + 1) * iVar11 + iVar13;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            uVar7 = (this->grid_height + 1) * iVar12 + iVar13 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            uVar7 = (this->grid_height + 1) * iVar11 + iVar13;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            uVar7 = (this->grid_height + 1) * iVar11 + iVar13 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar7;
            iVar3._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar3,(uint *)&box_mesh);
            }
            else {
              *iVar3._M_current = uVar7;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          bVar6 = iVar13 < this->grid_width;
          iVar13 = iVar13 + 1;
        } while (bVar6);
      }
      iVar11 = iVar11 + 1;
      bVar6 = iVar12 < this->grid_height;
      iVar12 = iVar12 + 1;
    } while (bVar6);
  }
  (*__glewGenBuffers)(1,&this->grid_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  pfVar4 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(this->grid_vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar4,pfVar4,0x88e4);
  (*__glewGenBuffers)(1,&this->grid_index_buffer);
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  puVar5 = (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8893,(long)(this->grid_indices).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5,puVar5,
                      0x88e4);
  (*__glewGenFramebuffers)(1,&this->depth_map_framebuffer);
  glGenTextures(1,&this->depth_map);
  glBindTexture(0xde1,this->depth_map);
  glTexImage2D(0xde1,0,0x1902,this->shadow_width,this->shadow_height,0,0x1902,0x1406,0);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->depth_map,0);
  glDrawBuffer(0);
  glReadBuffer(0);
  GVar8 = (*__glewCheckFramebufferStatus)(0x8d40);
  if (GVar8 != 0x8cd5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error creating texture",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  (*__glewBindFramebuffer)(0x8d40,0);
  box_mesh._M_dataplus._M_p = (pointer)&box_mesh.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&box_mesh,"box","");
  pMVar9 = ResourcePack::get_mesh(resource_pack,&box_mesh);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  (*__glewGenBuffers)(1,&this->object_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  pfVar4 = (pMVar9->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar9->vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar4,pfVar4,0x88e4);
  (*__glewGenBuffers)(1,&this->object_normal_buffer);
  (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
  pfVar4 = (pMVar9->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar9->normals).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar4,pfVar4,0x88e4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)box_mesh._M_dataplus._M_p != &box_mesh.field_2) {
    operator_delete(box_mesh._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scene::update(ResourcePack& resource_pack) {
    grid_vertices.reserve((grid_height+1)*(grid_width+1));
    for(int i=0; i < grid_height+1; ++i) {
        for(int j=0; j < grid_width+1; ++j) {
            grid_vertices.push_back(grid_start_x+grid_cell_size*j);
            grid_vertices.push_back(-1.0);
            grid_vertices.push_back(grid_start_y+grid_cell_size*i);
            if ((i<grid_height) && (j<grid_height)) {
                grid_indices.push_back(i*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back((i+1)*(grid_height+1)+j+1);
            }
        }
    }
    glGenBuffers(1, &grid_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(grid_vertices[0]) * grid_vertices.size(), grid_vertices.data(), GL_STATIC_DRAW);
    glGenBuffers(1, &grid_index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(grid_indices[0])*grid_indices.size(), grid_indices.data(), GL_STATIC_DRAW);

    glGenFramebuffers(1, &depth_map_framebuffer);

    glGenTextures(1, &depth_map);
    glBindTexture(GL_TEXTURE_2D, depth_map);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT, shadow_width, shadow_height, 0, GL_DEPTH_COMPONENT, GL_FLOAT, NULL);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

    glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depth_map, 0);
    glDrawBuffer(GL_NONE);
    glReadBuffer(GL_NONE);
    if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        std::cout << "error creating texture" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    std::string box_mesh("box");
        Mesh * objmesh = resource_pack.get_mesh(box_mesh);

    std::cout << objmesh->normals.size() << std::endl;

    glGenBuffers(1, &object_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->vertices.size(), objmesh->vertices.data(), GL_STATIC_DRAW);

    glGenBuffers(1, &object_normal_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->normals.size(), objmesh->normals.data(), GL_STATIC_DRAW);
}